

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O0

bool __thiscall ON_3dmObjectAttributes::Read(ON_3dmObjectAttributes *this,ON_BinaryArchive *file)

{
  undefined8 uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  int iVar4;
  uint uVar5;
  object_color_source oVar6;
  object_linetype_source oVar7;
  object_material_source oVar8;
  object_mode oVar9;
  object_decoration oVar10;
  plot_color_source pVar11;
  plot_weight_source pVar12;
  wchar_t *candidate_name;
  ON_DisplayMaterialRef *uuid;
  byte local_9d;
  ON_DisplayMaterialRef *dmr;
  int count;
  int i_local;
  uchar uc;
  ON_wString local_40;
  ON_wString name;
  double x;
  short s;
  bool rc;
  int minor_version;
  int major_version;
  int i;
  ON_BinaryArchive *file_local;
  ON_3dmObjectAttributes *this_local;
  
  _major_version = file;
  file_local = (ON_BinaryArchive *)this;
  Default(this);
  iVar4 = ON_BinaryArchive::Archive3dmVersion(_major_version);
  if ((iVar4 < 5) ||
     (uVar5 = ON_BinaryArchive::ArchiveOpenNURBSVersion(_major_version), uVar5 < 0xbf69ffe)) {
    _s = 0;
    x._4_4_ = 0;
    x._3_1_ = ON_BinaryArchive::Read3dmChunkVersion(_major_version,(int *)&s,(int *)((long)&x + 4));
    if (((bool)x._3_1_) && (_s == 1)) {
      if ((bool)x._3_1_) {
        x._3_1_ = ON_BinaryArchive::ReadUuid(_major_version,&this->m_uuid);
      }
      if ((bool)x._3_1_ != false) {
        x._3_1_ = ON_BinaryArchive::Read3dmReferencedComponentIndex
                            (_major_version,Layer,&this->m_layer_index);
      }
      if ((bool)x._3_1_ != false) {
        x._3_1_ = ON_BinaryArchive::Read3dmReferencedComponentIndex
                            (_major_version,Material,&this->m_material_index);
      }
      if ((bool)x._3_1_ != false) {
        x._3_1_ = ON_BinaryArchive::ReadColor(_major_version,&this->m_color);
      }
      if ((bool)x._3_1_ != false) {
        x._0_2_ = 0;
        x._3_1_ = ON_BinaryArchive::ReadShort(_major_version,(ON__INT16 *)&x);
        if ((bool)x._3_1_) {
          iVar4 = ON_BinaryArchive::Archive3dmVersion(_major_version);
          if ((iVar4 < 4) ||
             (uVar5 = ON_BinaryArchive::ArchiveOpenNURBSVersion(_major_version), uVar5 < 0xbf36f82))
          {
            oVar10 = ON::ObjectDecoration((int)x._0_2_ & 0x18);
            this->m_object_decoration = oVar10;
          }
          x._3_1_ = ON_BinaryArchive::ReadShort(_major_version,(ON__INT16 *)&x);
          if (((bool)x._3_1_) &&
             (x._3_1_ = ON_BinaryArchive::ReadDouble(_major_version,(double *)&name), (bool)x._3_1_)
             ) {
            x._3_1_ = ON_BinaryArchive::ReadDouble(_major_version,(double *)&name);
          }
        }
      }
      if ((bool)x._3_1_ != false) {
        x._3_1_ = ON_BinaryArchive::ReadInt(_major_version,&this->m_wire_density);
      }
      if ((bool)x._3_1_ != false) {
        x._3_1_ = ON_BinaryArchive::ReadChar(_major_version,&this->m_mode);
      }
      if ((bool)x._3_1_ != false) {
        x._3_1_ = ON_BinaryArchive::ReadChar(_major_version,&this->m_color_source);
      }
      if ((bool)x._3_1_ != false) {
        oVar6 = ON::ObjectColorSource((uint)this->m_color_source);
        this->m_color_source = (uchar)oVar6;
      }
      if ((x._3_1_ & 1) != 0) {
        x._3_1_ = ON_BinaryArchive::ReadChar(_major_version,&this->m_linetype_source);
      }
      if ((x._3_1_ & 1) != 0) {
        oVar7 = ON::ObjectLinetypeSource((uint)this->m_linetype_source);
        this->m_linetype_source = (uchar)oVar7;
      }
      if ((x._3_1_ & 1) != 0) {
        x._3_1_ = ON_BinaryArchive::ReadChar(_major_version,&this->m_material_source);
      }
      if ((x._3_1_ & 1) != 0) {
        oVar8 = ON::ObjectMaterialSource((uint)this->m_material_source);
        this->m_material_source = (uchar)oVar8;
      }
      ON_wString::ON_wString(&local_40);
      if ((x._3_1_ & 1) != 0) {
        x._3_1_ = ON_BinaryArchive::ReadString(_major_version,&local_40);
      }
      if ((x._3_1_ & 1) != 0) {
        candidate_name = ON_wString::operator_cast_to_wchar_t_(&local_40);
        SetName(this,candidate_name,true);
      }
      if ((x._3_1_ & 1) != 0) {
        x._3_1_ = ON_BinaryArchive::ReadString(_major_version,&this->m_url);
      }
      oVar9 = Mode(this);
      this->m_bVisible = oVar9 != hidden_object;
      if (((((x._3_1_ & 1) != 0) && (0 < x._4_4_)) &&
          (x._3_1_ = ON_BinaryArchive::Read3dmReferencedComponentIndexArray
                               (_major_version,Group,&this->m_group), (bool)x._3_1_)) &&
         (((1 < x._4_4_ &&
           (x._3_1_ = ON_BinaryArchive::ReadBool(_major_version,&this->m_bVisible), (bool)x._3_1_))
          && ((2 < x._4_4_ &&
              ((x._3_1_ = ON_BinaryArchive::ReadArray(_major_version,&this->m_dmref), (bool)x._3_1_
               && (3 < x._4_4_)))))))) {
        minor_version = 0;
        if ((bool)x._3_1_) {
          x._3_1_ = ON_BinaryArchive::ReadInt(_major_version,&minor_version);
        }
        if ((bool)x._3_1_ != false) {
          oVar10 = ON::ObjectDecoration(minor_version);
          this->m_object_decoration = oVar10;
        }
        if ((x._3_1_ & 1) != 0) {
          x._3_1_ = ON_BinaryArchive::ReadChar(_major_version,&this->m_plot_color_source);
        }
        if ((x._3_1_ & 1) != 0) {
          pVar11 = ON::PlotColorSource((uint)this->m_plot_color_source);
          this->m_plot_color_source = (uchar)pVar11;
        }
        if ((x._3_1_ & 1) != 0) {
          x._3_1_ = ON_BinaryArchive::ReadColor(_major_version,&this->m_plot_color);
        }
        if ((x._3_1_ & 1) != 0) {
          x._3_1_ = ON_BinaryArchive::ReadChar(_major_version,&this->m_plot_weight_source);
        }
        if ((x._3_1_ & 1) != 0) {
          pVar12 = ON::PlotWeightSource((uint)this->m_plot_weight_source);
          this->m_plot_weight_source = (uchar)pVar12;
        }
        if ((x._3_1_ & 1) != 0) {
          x._3_1_ = ON_BinaryArchive::ReadDouble(_major_version,&this->m_plot_weight_mm);
        }
        if (((x._3_1_ & 1) != 0) && (4 < x._4_4_)) {
          if ((x._3_1_ & 1) != 0) {
            x._3_1_ = ON_BinaryArchive::Read3dmReferencedComponentIndex
                                (_major_version,LinePattern,&this->m_linetype_index);
          }
          if (((x._3_1_ & 1) != 0) && (5 < x._4_4_)) {
            count._3_1_ = '\0';
            x._3_1_ = ON_BinaryArchive::ReadChar(_major_version,(ON__UINT8 *)((long)&count + 3));
            if ((bool)x._3_1_) {
              this->m_space = (count._3_1_ == '\x01') + model_space;
              ON_SimpleArray<ON_DisplayMaterialRef>::Empty(&this->m_dmref);
              dmr._0_4_ = 0;
              x._3_1_ = ON_BinaryArchive::ReadInt(_major_version,(ON__INT32 *)&dmr);
              if (((bool)x._3_1_) && (0 < (int)dmr)) {
                ON_SimpleArray<ON_DisplayMaterialRef>::SetCapacity(&this->m_dmref,(long)(int)dmr);
                dmr._4_4_ = 0;
                while( true ) {
                  local_9d = 0;
                  if (dmr._4_4_ < (int)dmr) {
                    local_9d = x._3_1_;
                  }
                  if ((local_9d & 1) == 0) break;
                  uuid = ON_SimpleArray<ON_DisplayMaterialRef>::AppendNew(&this->m_dmref);
                  x._3_1_ = ON_BinaryArchive::ReadUuid(_major_version,&uuid->m_viewport_id);
                  if ((bool)x._3_1_) {
                    x._3_1_ = ON_BinaryArchive::ReadUuid
                                        (_major_version,&uuid->m_display_material_id);
                  }
                  if (((bool)x._3_1_ != false) &&
                     (iVar4 = ON_UuidCompare(&ON_ObsoletePageSpaceObjectId,
                                             &uuid->m_display_material_id), iVar4 == 0)) {
                    uVar2 = (uuid->m_viewport_id).Data2;
                    uVar3 = (uuid->m_viewport_id).Data3;
                    uVar1 = *(undefined8 *)(uuid->m_viewport_id).Data4;
                    (this->m_viewport_id).Data1 = (uuid->m_viewport_id).Data1;
                    (this->m_viewport_id).Data2 = uVar2;
                    (this->m_viewport_id).Data3 = uVar3;
                    *(undefined8 *)(this->m_viewport_id).Data4 = uVar1;
                    ON_SimpleArray<ON_DisplayMaterialRef>::Remove(&this->m_dmref);
                  }
                  dmr._4_4_ = dmr._4_4_ + 1;
                }
                iVar4 = ON_SimpleArray<ON_DisplayMaterialRef>::Count(&this->m_dmref);
                if (iVar4 == 0) {
                  ON_SimpleArray<ON_DisplayMaterialRef>::Destroy(&this->m_dmref);
                }
              }
            }
            if ((((x._3_1_ & 1) != 0) && (6 < x._4_4_)) && ((x._3_1_ & 1) != 0)) {
              x._3_1_ = ON_ObjectRenderingAttributes::Read
                                  (&this->m_rendering_attributes,_major_version);
            }
          }
        }
      }
      ON_wString::~ON_wString(&local_40);
    }
    else {
      x._3_1_ = 0;
    }
    this_local._7_1_ = (bool)(x._3_1_ & 1);
  }
  else {
    this_local._7_1_ = Internal_ReadV5(this,_major_version);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_3dmObjectAttributes::Read( ON_BinaryArchive& file )
{
  Default();
  if (    file.Archive3dmVersion() >= 5 
       && file.ArchiveOpenNURBSVersion() >= 200712190 )
  {
    return Internal_ReadV5(file);
  }
  int i;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if ( rc && major_version == 1 ) 
  {
    if (rc) rc = file.ReadUuid(m_uuid);
    if (rc) rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::Layer,&m_layer_index);
    if (rc) rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::RenderMaterial,&m_material_index);
    if (rc) rc = file.ReadColor(m_color);
    
    while(rc)
    {
      // OBSOLETE if (rc) rc = file.ReadLineStyle(m_line_style); // 23 March 2005 Dale Lear
      // replaced with
      short s = 0;
      double x;
      rc = file.ReadShort(&s); 
      if (!rc) break;
      if ( file.Archive3dmVersion() < 4 || file.ArchiveOpenNURBSVersion() < 200503170 )
      {
        // ignore unused linestyle info in old files
        // This bit keeps the curve arrowheads from V3 showing up
        // in V4.
        m_object_decoration = ON::ObjectDecoration( (s & ON::both_arrowhead) );
      }
      rc = file.ReadShort(&s);
      if (!rc) break;
      rc = file.ReadDouble(&x);
      if (!rc) break;
      rc = file.ReadDouble(&x);
      break;
    }

    if (rc) rc = file.ReadInt(&m_wire_density);
    if (rc) rc = file.ReadChar(&m_mode);

    if (rc) rc = file.ReadChar(&m_color_source);
    if (rc) m_color_source = (unsigned char)ON::ObjectColorSource(m_color_source);

    if (rc) rc = file.ReadChar(&m_linetype_source);
    if (rc) m_linetype_source = (unsigned char)ON::ObjectLinetypeSource(m_linetype_source);

    if (rc) rc = file.ReadChar(&m_material_source);
    if (rc) m_material_source = (unsigned char)ON::ObjectMaterialSource(m_material_source);

    ON_wString name;
    if (rc) rc = file.ReadString(name);
    if (rc)
      SetName(name, true);

    if (rc) rc = file.ReadString(m_url);

    m_bVisible = (Mode() != ON::hidden_object);
    if ( rc && minor_version >= 1 ) 
    {
      rc = file.Read3dmReferencedComponentIndexArray(ON_ModelComponent::Type::Group, m_group);
      if ( rc && minor_version >= 2 )
      {
        rc = file.ReadBool(&m_bVisible);

        if ( rc && minor_version >= 3 )
        {
          rc = file.ReadArray(m_dmref);     

          if (rc && minor_version >= 4 )
          {
            // 23 March 2005 Dale Lear
            //    Added m_plot_color_source and m_plot_color
            i = 0;
            if (rc) rc = file.ReadInt(&i);
            if (rc) m_object_decoration = ON::ObjectDecoration(i);
            if (rc) rc = file.ReadChar(&m_plot_color_source);
            if (rc) m_plot_color_source = (unsigned char)ON::PlotColorSource(m_plot_color_source);
            if (rc) rc = file.ReadColor( m_plot_color );
            if (rc) rc = file.ReadChar(&m_plot_weight_source);
            if (rc) m_plot_weight_source = (unsigned char)ON::PlotWeightSource(m_plot_weight_source);
            if (rc) rc = file.ReadDouble(&m_plot_weight_mm);


            if (rc && minor_version >= 5 )
            {
              // version 1.5 fields 11 April 2005
              if (rc) rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::LinePattern,&m_linetype_index);

              // version 1.6 fields 2 September 2005
              if (rc && minor_version >= 6 )
              {
                unsigned char uc = 0;
                rc = file.ReadChar(&uc);
                if (rc)
                {
                  m_space = (1 == uc) ? ON::page_space : ON::model_space;
                  m_dmref.Empty();
                  int i_local, count=0;
                  rc = file.ReadInt(&count);
                  if (rc && count > 0)
                  {
                    m_dmref.SetCapacity(count);
                    for ( i_local = 0; i_local < count && rc; i_local++)
                    {
                      ON_DisplayMaterialRef& dmr = m_dmref.AppendNew();
                      rc = file.ReadUuid(dmr.m_viewport_id);
                      if (rc) rc = file.ReadUuid(dmr.m_display_material_id);
                      if ( rc )
                      {
                        // Assigning an object to a page started out as
                        // using dmrs.  The way the runtime info is saved
                        // has changed, but, at this point, I can't change
                        // the way the information is saved in the file and
                        // it doesn't matter.
                        if ( 0 == ON_UuidCompare(&ON_ObsoletePageSpaceObjectId,&dmr.m_display_material_id) )
                        {
                          m_viewport_id = dmr.m_viewport_id;
                          m_dmref.Remove();
                        }
                      }
                    }
                    if ( 0 == m_dmref.Count() )
                      m_dmref.Destroy();
                  }
                }

                if ( rc && minor_version >= 7 )
                {
                  // version 1.7 fields 6 June 2006
                  if (rc) rc = m_rendering_attributes.Read(file);
                }
              }
            }
          }
        }
      }
    }
  }
  else 
  {
    rc = false;
  }
  return rc;
}